

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O0

size_t polyscope::pick::requestPickBufferRange(Structure *requestingStructure,size_t count)

{
  ulong uVar1;
  ulong in_RSI;
  size_t ret;
  size_t maxPickInd;
  allocator *in_stack_ffffffffffffff88;
  vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
  *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [32];
  unsigned_long local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  local_18 = std::numeric_limits<unsigned_long>::max();
  if ((local_18 < local_10) || (local_18 - local_10 < nextPickBufferInd)) {
    in_stack_ffffffffffffff88 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "Wow, you sure do have a lot of stuff, Polyscope can\'t even count it all. (Ran out of indices while enumerating structure elements for pick buffer.)"
               ,in_stack_ffffffffffffff88);
    polyscope::error((string *)ret);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  uVar1 = nextPickBufferInd;
  nextPickBufferInd = local_10 + nextPickBufferInd;
  std::make_tuple<unsigned_long&,unsigned_long&,polyscope::Structure*&>
            (in_stack_ffffffffffffff98,(unsigned_long *)in_stack_ffffffffffffff90,
             (Structure **)in_stack_ffffffffffffff88);
  std::
  vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
  ::push_back(in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
  return uVar1;
}

Assistant:

size_t requestPickBufferRange(Structure* requestingStructure, size_t count) {

  // Check if we can satisfy the request
  size_t maxPickInd = std::numeric_limits<size_t>::max();
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wshift-count-overflow"
  if (bitsForPickPacking < 22) {
    uint64_t bitMax = 1ULL << (bitsForPickPacking * 3);
    if (bitMax < maxPickInd) {
      maxPickInd = bitMax;
    }
  }
#pragma GCC diagnostic pop

  if (count > maxPickInd || maxPickInd - count < nextPickBufferInd) {
    error("Wow, you sure do have a lot of stuff, Polyscope can't even count it all. (Ran out of indices while "
          "enumerating structure elements for pick buffer.)");
  }

  size_t ret = nextPickBufferInd;
  nextPickBufferInd += count;
  structureRanges.push_back(std::make_tuple(ret, nextPickBufferInd, requestingStructure));
  return ret;
}